

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O1

int rtr_mgr_start_sockets(rtr_mgr_group *group)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  bool bVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = group->sockets_len != 0;
  if (bVar4) {
    iVar2 = rtr_start(*group->sockets);
    if (iVar2 == 0) {
      uVar3 = 1;
      do {
        bVar4 = uVar3 < group->sockets_len;
        if (!bVar4) goto LAB_001066e9;
        iVar2 = rtr_start(group->sockets[uVar3]);
        uVar3 = uVar3 + 1;
      } while (iVar2 == 0);
    }
    lrtr_dbg("RTR_MGR: rtr_mgr: Error starting rtr_socket pthread");
    iVar2 = -1;
    if (bVar4) goto LAB_001066f2;
  }
LAB_001066e9:
  group->status = RTR_MGR_CONNECTING;
  iVar2 = 0;
LAB_001066f2:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

static int rtr_mgr_start_sockets(struct rtr_mgr_group *group)
{
	for (unsigned int i = 0; i < group->sockets_len; i++) {
		if (rtr_start(group->sockets[i]) != 0) {
			MGR_DBG1("rtr_mgr: Error starting rtr_socket pthread");
			return RTR_ERROR;
		}
	}
	group->status = RTR_MGR_CONNECTING;
	return RTR_SUCCESS;
}